

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
BuildTestPhonySelfReference::~BuildTestPhonySelfReference(BuildTestPhonySelfReference *this)

{
  BuildTestPhonySelfReference *this_local;
  
  ~BuildTestPhonySelfReference(this);
  operator_delete(this,0x460);
  return;
}

Assistant:

TEST_F(BuildTest, PhonySelfReference) {
  string err;
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build a: phony a\n"));

  EXPECT_TRUE(builder_.AddTarget("a", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.AlreadyUpToDate());
}